

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::GetPatternFunc::GetPatternFunc(GetPatternFunc *this)

{
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,GetPattern,Function);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_005a3a18;
  return;
}

Assistant:

GetPatternFunc() : SystemSubroutine(KnownSystemName::GetPattern, SubroutineKind::Function) {}